

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O1

void __thiscall
ktx::CommandCompare::compareHeader(CommandCompare *this,PrintDiff *diff,InputStreams *streams)

{
  vector<KTX_header2,_std::allocator<KTX_header2>_> *pvVar1;
  uint uVar2;
  uint uVar3;
  pointer pKVar4;
  long lVar5;
  string_view what;
  string_view textHeaderIn;
  string_view textHeaderIn_00;
  string_view textHeaderIn_01;
  string_view jsonPathIn;
  string_view jsonPathIn_00;
  string_view jsonPathIn_01;
  undefined1 local_b8 [48];
  _Optional_payload_base<VkFormat> local_88;
  bool local_80;
  undefined7 uStack_7f;
  undefined1 local_78;
  bool local_70;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  ktx_uint32_t local_44;
  array<unsigned_char,_12UL> local_40;
  
  local_b8._0_8_ = local_b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"Header\n\n","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&diff->context,
                    (diff->context).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&diff->context,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
  if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
  }
  what._M_str = "header";
  what._M_len = 6;
  read<KTX_header2>((vector<KTX_header2,_std::allocator<KTX_header2>_> *)local_b8,this,streams,0,
                    what);
  pvVar1 = &this->headers;
  std::vector<KTX_header2,_std::allocator<KTX_header2>_>::_M_move_assign
            (pvVar1,(vector<KTX_header2,_std::allocator<KTX_header2>_> *)local_b8);
  if ((pointer)local_b8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ - local_b8._0_8_);
  }
  pKVar4 = (this->headers).super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_68._M_unused._0_8_ = (undefined8)*(undefined8 *)pKVar4->identifier;
  local_68._8_4_ = *(undefined4 *)(pKVar4->identifier + 8);
  local_40._M_elems._8_4_ = *(undefined4 *)(pKVar4[1].identifier + 8);
  local_40._M_elems._0_8_ = *(undefined8 *)pKVar4[1].identifier;
  textHeaderIn._M_str = "identifier";
  textHeaderIn._M_len = 10;
  jsonPathIn._M_str = "/header/identifier";
  jsonPathIn._M_len = 0x12;
  DiffBase<std::array<unsigned_char,_12UL>_>::DiffBase
            ((DiffBase<std::array<unsigned_char,_12UL>_> *)local_b8,textHeaderIn,jsonPathIn,
             (array<unsigned_char,_12UL> *)&local_68,&local_40);
  local_b8._0_8_ = &PTR_value_abi_cxx11__0025e9a0;
  PrintDiff::operator<<(diff,(DiffBase<std::array<unsigned_char,_12UL>_> *)local_b8);
  if ((this->options).super_OptionsCompare.ignoreFormatHeader == false) {
    pKVar4 = (this->headers).super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_40._M_elems._0_4_ = pKVar4->vkFormat;
    local_44 = pKVar4[1].vkFormat;
    local_68._8_8_ = 0;
    pcStack_50 = std::
                 _Function_handler<const_char_*(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_compare.cpp:1465:13)>
                 ::_M_invoke;
    local_58 = std::
               _Function_handler<const_char_*(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_compare.cpp:1465:13)>
               ::_M_manager;
    textHeaderIn_00._M_str = "vkFormat";
    textHeaderIn_00._M_len = 8;
    jsonPathIn_00._M_str = "/header/vkFormat";
    jsonPathIn_00._M_len = 0x10;
    local_68._M_unused._M_object = this;
    DiffEnum<VkFormat>::DiffEnum
              ((DiffEnum<VkFormat> *)local_b8,textHeaderIn_00,jsonPathIn_00,(int32_t *)&local_40,
               (int32_t *)&local_44,(function<const_char_*(unsigned_long)> *)&local_68);
    PrintDiff::operator<<(diff,(DiffBase<VkFormat> *)local_b8);
    if (local_58 != (code *)0x0) {
      (*local_58)(&local_68,&local_68,__destroy_functor);
    }
    pKVar4 = (pvVar1->super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_b8._8_8_ = (pointer)0x8;
    local_b8._16_8_ = (long)"/header/typeSize" + 8;
    local_b8._24_8_ = 0x10;
    local_b8._32_8_ = "/header/typeSize";
    lVar5 = 0x2c;
    do {
      local_b8[lVar5] = 0;
      lVar5 = lVar5 + 8;
    } while (lVar5 != 0x3c);
    uVar2 = pKVar4->typeSize;
    uVar3 = pKVar4[1].typeSize;
    local_80 = uVar2 != uVar3;
    local_b8._40_8_ = (ulong)uVar2 | 0x100000000;
    local_88 = (_Optional_payload_base<VkFormat>)((ulong)uVar3 | 0x100000000);
    local_b8._0_8_ = &PTR_value_abi_cxx11__0025f100;
    PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)local_b8);
  }
  pKVar4 = (pvVar1->super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_b8._8_8_ = (pointer)0xa;
  local_b8._16_8_ = (long)"/header/pixelWidth" + 8;
  local_b8._24_8_ = 0x12;
  local_b8._32_8_ = "/header/pixelWidth";
  lVar5 = 0x2c;
  do {
    local_b8[lVar5] = 0;
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x3c);
  uVar2 = pKVar4->pixelWidth;
  uVar3 = pKVar4[1].pixelWidth;
  local_80 = uVar2 != uVar3;
  local_b8._40_8_ = (ulong)uVar2 | 0x100000000;
  local_88 = (_Optional_payload_base<VkFormat>)((ulong)uVar3 | 0x100000000);
  local_b8._0_8_ = &PTR_value_abi_cxx11__0025f100;
  PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)local_b8);
  pKVar4 = (pvVar1->super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_b8._8_8_ = (pointer)0xb;
  local_b8._16_8_ = (long)"/header/pixelHeight" + 8;
  local_b8._24_8_ = 0x13;
  local_b8._32_8_ = "/header/pixelHeight";
  lVar5 = 0x2c;
  do {
    local_b8[lVar5] = 0;
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x3c);
  uVar2 = pKVar4->pixelHeight;
  uVar3 = pKVar4[1].pixelHeight;
  local_80 = uVar2 != uVar3;
  local_b8._40_8_ = (ulong)uVar2 | 0x100000000;
  local_88 = (_Optional_payload_base<VkFormat>)((ulong)uVar3 | 0x100000000);
  local_b8._0_8_ = &PTR_value_abi_cxx11__0025f100;
  PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)local_b8);
  pKVar4 = (pvVar1->super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_b8._8_8_ = (pointer)0xa;
  local_b8._16_8_ = (long)"/header/pixelDepth" + 8;
  local_b8._24_8_ = 0x12;
  local_b8._32_8_ = "/header/pixelDepth";
  lVar5 = 0x2c;
  do {
    local_b8[lVar5] = 0;
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x3c);
  uVar2 = pKVar4->pixelDepth;
  uVar3 = pKVar4[1].pixelDepth;
  local_80 = uVar2 != uVar3;
  local_b8._40_8_ = (ulong)uVar2 | 0x100000000;
  local_88 = (_Optional_payload_base<VkFormat>)((ulong)uVar3 | 0x100000000);
  local_b8._0_8_ = &PTR_value_abi_cxx11__0025f100;
  PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)local_b8);
  pKVar4 = (pvVar1->super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_b8._8_8_ = (pointer)0xa;
  local_b8._16_8_ = (long)"/header/layerCount" + 8;
  local_b8._24_8_ = 0x12;
  local_b8._32_8_ = "/header/layerCount";
  lVar5 = 0x2c;
  do {
    local_b8[lVar5] = 0;
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x3c);
  uVar2 = pKVar4->layerCount;
  uVar3 = pKVar4[1].layerCount;
  local_80 = uVar2 != uVar3;
  local_b8._40_8_ = (ulong)uVar2 | 0x100000000;
  local_88 = (_Optional_payload_base<VkFormat>)((ulong)uVar3 | 0x100000000);
  local_b8._0_8_ = &PTR_value_abi_cxx11__0025f100;
  PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)local_b8);
  pKVar4 = (pvVar1->super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_b8._8_8_ = (pointer)0x9;
  local_b8._16_8_ = (long)"/header/faceCount" + 8;
  local_b8._24_8_ = 0x11;
  local_b8._32_8_ = "/header/faceCount";
  lVar5 = 0x2c;
  do {
    local_b8[lVar5] = 0;
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x3c);
  uVar2 = pKVar4->faceCount;
  uVar3 = pKVar4[1].faceCount;
  local_80 = uVar2 != uVar3;
  local_b8._40_8_ = (ulong)uVar2 | 0x100000000;
  local_88 = (_Optional_payload_base<VkFormat>)((ulong)uVar3 | 0x100000000);
  local_b8._0_8_ = &PTR_value_abi_cxx11__0025f100;
  PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)local_b8);
  pKVar4 = (pvVar1->super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_b8._8_8_ = (pointer)0xa;
  local_b8._16_8_ = (long)"/header/levelCount" + 8;
  local_b8._24_8_ = 0x12;
  local_b8._32_8_ = "/header/levelCount";
  lVar5 = 0x2c;
  do {
    local_b8[lVar5] = 0;
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x3c);
  uVar2 = pKVar4->levelCount;
  uVar3 = pKVar4[1].levelCount;
  local_80 = uVar2 != uVar3;
  local_b8._40_8_ = (ulong)uVar2 | 0x100000000;
  local_88 = (_Optional_payload_base<VkFormat>)((ulong)uVar3 | 0x100000000);
  local_b8._0_8_ = &PTR_value_abi_cxx11__0025f100;
  PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)local_b8);
  if ((this->options).super_OptionsCompare.ignoreSupercomp == false) {
    pKVar4 = (pvVar1->super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>)._M_impl.
             super__Vector_impl_data._M_start;
    textHeaderIn_01._M_str = "supercompressionScheme";
    textHeaderIn_01._M_len = 0x16;
    jsonPathIn_01._M_str = "/header/supercompressionScheme";
    jsonPathIn_01._M_len = 0x1e;
    DiffEnum<ktxSupercmpScheme>::DiffEnum
              ((DiffEnum<ktxSupercmpScheme> *)local_b8,textHeaderIn_01,jsonPathIn_01,
               &pKVar4->supercompressionScheme,&pKVar4[1].supercompressionScheme);
    PrintDiff::operator<<(diff,(DiffBase<ktxSupercmpScheme> *)local_b8);
  }
  if ((this->options).super_OptionsCompare.ignoreIndex != all) {
    pKVar4 = (pvVar1->super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_b8._8_8_ = (pointer)0x1f;
    local_b8._16_8_ = "dataFormatDescriptor.byteOffset";
    local_b8._24_8_ = 0x26;
    local_b8._32_8_ = "/index/dataFormatDescriptor/byteOffset";
    lVar5 = 0x2c;
    do {
      local_b8[lVar5] = 0;
      lVar5 = lVar5 + 8;
    } while (lVar5 != 0x3c);
    uVar2 = (pKVar4->dataFormatDescriptor).byteOffset;
    uVar3 = pKVar4[1].dataFormatDescriptor.byteOffset;
    local_80 = uVar2 != uVar3;
    local_b8._40_8_ = (ulong)uVar2 | 0x100000000;
    local_88 = (_Optional_payload_base<VkFormat>)((ulong)uVar3 | 0x100000000);
    local_b8._0_8_ = &PTR_value_abi_cxx11__0025f130;
    PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)local_b8);
    pKVar4 = (pvVar1->super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_b8._8_8_ = (pointer)0x1f;
    local_b8._16_8_ = "dataFormatDescriptor.byteLength";
    local_b8._24_8_ = 0x26;
    local_b8._32_8_ = "/index/dataFormatDescriptor/byteLength";
    lVar5 = 0x2c;
    do {
      local_b8[lVar5] = 0;
      lVar5 = lVar5 + 8;
    } while (lVar5 != 0x3c);
    uVar2 = (pKVar4->dataFormatDescriptor).byteLength;
    uVar3 = pKVar4[1].dataFormatDescriptor.byteLength;
    local_80 = uVar2 != uVar3;
    local_b8._40_8_ = (ulong)uVar2 | 0x100000000;
    local_88 = (_Optional_payload_base<VkFormat>)((ulong)uVar3 | 0x100000000);
    local_b8._0_8_ = &PTR_value_abi_cxx11__0025f100;
    PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)local_b8);
    pKVar4 = (pvVar1->super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_b8._8_8_ = (pointer)0x17;
    local_b8._16_8_ = "keyValueData.byteOffset";
    local_b8._24_8_ = 0x1e;
    local_b8._32_8_ = "/index/keyValueData/byteOffset";
    lVar5 = 0x2c;
    do {
      local_b8[lVar5] = 0;
      lVar5 = lVar5 + 8;
    } while (lVar5 != 0x3c);
    uVar2 = (pKVar4->keyValueData).byteOffset;
    uVar3 = pKVar4[1].keyValueData.byteOffset;
    local_80 = uVar2 != uVar3;
    local_b8._40_8_ = (ulong)uVar2 | 0x100000000;
    local_88 = (_Optional_payload_base<VkFormat>)((ulong)uVar3 | 0x100000000);
    local_b8._0_8_ = &PTR_value_abi_cxx11__0025f130;
    PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)local_b8);
    pKVar4 = (pvVar1->super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_b8._8_8_ = (pointer)0x17;
    local_b8._16_8_ = "keyValueData.byteLength";
    local_b8._24_8_ = 0x1e;
    local_b8._32_8_ = "/index/keyValueData/byteLength";
    lVar5 = 0x2c;
    do {
      local_b8[lVar5] = 0;
      lVar5 = lVar5 + 8;
    } while (lVar5 != 0x3c);
    uVar2 = (pKVar4->keyValueData).byteLength;
    uVar3 = pKVar4[1].keyValueData.byteLength;
    local_80 = uVar2 != uVar3;
    local_b8._40_8_ = (ulong)uVar2 | 0x100000000;
    local_88 = (_Optional_payload_base<VkFormat>)((ulong)uVar3 | 0x100000000);
    local_b8._0_8_ = &PTR_value_abi_cxx11__0025f100;
    PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)local_b8);
    pKVar4 = (pvVar1->super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_b8._8_8_ = (pointer)0x25;
    local_b8._16_8_ = "supercompressionGlobalData.byteOffset";
    local_b8._24_8_ = 0x2c;
    local_b8._32_8_ = "/index/supercompressionGlobalData/byteOffset";
    lVar5 = 0x30;
    do {
      local_b8[lVar5] = 0;
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x50);
    local_b8._40_8_ = (pKVar4->supercompressionGlobalData).byteOffset;
    _local_80 = pKVar4[1].supercompressionGlobalData.byteOffset;
    local_70 = local_b8._40_8_ != _local_80;
    local_88._M_payload._M_value._0_1_ = 1;
    local_78 = '\x01';
    local_b8._0_8_ = &PTR_value_abi_cxx11__0025f160;
    PrintDiff::operator<<(diff,(DiffBase<unsigned_long> *)local_b8);
    pKVar4 = (pvVar1->super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_b8._8_8_ = (pointer)0x25;
    local_b8._16_8_ = "supercompressionGlobalData.byteLength";
    local_b8._24_8_ = 0x2c;
    local_b8._32_8_ = "/index/supercompressionGlobalData/byteLength";
    lVar5 = 0x30;
    do {
      local_b8[lVar5] = 0;
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x50);
    local_b8._40_8_ = (pKVar4->supercompressionGlobalData).byteLength;
    _local_80 = pKVar4[1].supercompressionGlobalData.byteLength;
    local_70 = local_b8._40_8_ != _local_80;
    local_88._M_payload._M_value._0_1_ = 1;
    local_78 = '\x01';
    local_b8._0_8_ = &PTR_value_abi_cxx11__0025f1b8;
    PrintDiff::operator<<(diff,(DiffBase<unsigned_long> *)local_b8);
  }
  return;
}

Assistant:

void CommandCompare::compareHeader(PrintDiff& diff, InputStreams& streams) {
    diff.setContext("Header\n\n");

    headers = read<KTX_header2>(streams, 0, "header");

    diff << DiffIdentifier("identifier", "/header/identifier", headers[0], headers[1]);

    if (!options.ignoreFormatHeader) {
        diff << DiffEnum<VkFormat>("vkFormat", "/header/vkFormat", headers[0].vkFormat, headers[1].vkFormat,
            [&](auto i) { return vkFormatString(VkFormat(headers[i].vkFormat)); });
        diff << Diff("typeSize", "/header/typeSize", headers[0].typeSize, headers[1].typeSize);
    }

    diff << Diff("pixelWidth", "/header/pixelWidth", headers[0].pixelWidth, headers[1].pixelWidth);
    diff << Diff("pixelHeight", "/header/pixelHeight", headers[0].pixelHeight, headers[1].pixelHeight);
    diff << Diff("pixelDepth", "/header/pixelDepth", headers[0].pixelDepth, headers[1].pixelDepth);
    diff << Diff("layerCount", "/header/layerCount", headers[0].layerCount, headers[1].layerCount);
    diff << Diff("faceCount", "/header/faceCount", headers[0].faceCount, headers[1].faceCount);
    diff << Diff("levelCount", "/header/levelCount", headers[0].levelCount, headers[1].levelCount);

    if (!options.ignoreSupercomp)
        diff << DiffEnum<ktxSupercmpScheme>("supercompressionScheme", "/header/supercompressionScheme",
            headers[0].supercompressionScheme, headers[1].supercompressionScheme);

    if (options.ignoreIndex != IgnoreIndex::all) {
        diff << DiffHex("dataFormatDescriptor.byteOffset", "/index/dataFormatDescriptor/byteOffset",
            headers[0].dataFormatDescriptor.byteOffset, headers[1].dataFormatDescriptor.byteOffset);
        diff << Diff("dataFormatDescriptor.byteLength", "/index/dataFormatDescriptor/byteLength",
            headers[0].dataFormatDescriptor.byteLength, headers[1].dataFormatDescriptor.byteLength);

        diff << DiffHex("keyValueData.byteOffset", "/index/keyValueData/byteOffset",
            headers[0].keyValueData.byteOffset, headers[1].keyValueData.byteOffset);
        diff << Diff("keyValueData.byteLength", "/index/keyValueData/byteLength",
            headers[0].keyValueData.byteLength, headers[1].keyValueData.byteLength);

        diff << DiffHex("supercompressionGlobalData.byteOffset", "/index/supercompressionGlobalData/byteOffset",
            headers[0].supercompressionGlobalData.byteOffset, headers[1].supercompressionGlobalData.byteOffset);
        diff << Diff("supercompressionGlobalData.byteLength", "/index/supercompressionGlobalData/byteLength",
            headers[0].supercompressionGlobalData.byteLength, headers[1].supercompressionGlobalData.byteLength);
    }
}